

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int HalfFloatPlane(uint16_t *src_y,int src_stride_y,uint16_t *dst_y,int dst_stride_y,float scale,
                  int width,int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  _func_void_uint16_t_ptr_uint16_t_ptr_float_int *HalfFloatRow;
  int y;
  code *pcVar2;
  int local_34;
  int local_30;
  uint local_2c;
  uint local_24;
  long local_20;
  uint local_14;
  long local_10;
  int local_4;
  
  pcVar2 = HalfFloatRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI >> 1;
    local_24 = in_ECX >> 1;
    local_30 = in_R9D;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      local_30 = -in_R9D;
      local_10 = in_RDI + (long)(int)((local_30 + -1) * local_14) * 2;
      local_14 = -local_14;
    }
    local_2c = in_R8D;
    if ((local_14 == in_R8D) && (local_24 == in_R8D)) {
      local_2c = local_30 * in_R8D;
      local_30 = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = HalfFloatRow_Any_SSE2, (local_2c & 7) == 0)) {
      pcVar2 = HalfFloatRow_SSE2;
    }
    iVar1 = libyuv::TestCpuFlag(0);
    if ((iVar1 != 0) && (pcVar2 = HalfFloatRow_Any_AVX2, (local_2c & 0xf) == 0)) {
      pcVar2 = HalfFloatRow_AVX2;
    }
    local_20 = in_RDX;
    for (local_34 = 0; local_34 < local_30; local_34 = local_34 + 1) {
      (*pcVar2)(in_XMM0_Da,local_10,local_20,local_2c);
      local_10 = local_10 + (long)(int)local_14 * 2;
      local_20 = local_20 + (long)(int)local_24 * 2;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int HalfFloatPlane(const uint16_t* src_y,
                   int src_stride_y,
                   uint16_t* dst_y,
                   int dst_stride_y,
                   float scale,
                   int width,
                   int height) {
  int y;
  void (*HalfFloatRow)(const uint16_t* src, uint16_t* dst, float scale,
                       int width) = HalfFloatRow_C;
  if (!src_y || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  src_stride_y >>= 1;
  dst_stride_y >>= 1;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_y = src_y + (height - 1) * src_stride_y;
    src_stride_y = -src_stride_y;
  }
  // Coalesce rows.
  if (src_stride_y == width && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_y = dst_stride_y = 0;
  }
#if defined(HAS_HALFFLOATROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    HalfFloatRow = HalfFloatRow_Any_SSE2;
    if (IS_ALIGNED(width, 8)) {
      HalfFloatRow = HalfFloatRow_SSE2;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    HalfFloatRow = HalfFloatRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      HalfFloatRow = HalfFloatRow_AVX2;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_F16C)
  if (TestCpuFlag(kCpuHasAVX2) && TestCpuFlag(kCpuHasF16C)) {
    HalfFloatRow =
        (scale == 1.0f) ? HalfFloat1Row_Any_F16C : HalfFloatRow_Any_F16C;
    if (IS_ALIGNED(width, 16)) {
      HalfFloatRow = (scale == 1.0f) ? HalfFloat1Row_F16C : HalfFloatRow_F16C;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    HalfFloatRow =
        (scale == 1.0f) ? HalfFloat1Row_Any_NEON : HalfFloatRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      HalfFloatRow = (scale == 1.0f) ? HalfFloat1Row_NEON : HalfFloatRow_NEON;
    }
  }
#endif
#if defined(HAS_HALFFLOATROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    HalfFloatRow = HalfFloatRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      HalfFloatRow = HalfFloatRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    HalfFloatRow(src_y, dst_y, scale, width);
    src_y += src_stride_y;
    dst_y += dst_stride_y;
  }
  return 0;
}